

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O3

void __thiscall Preprocessor::Init(Preprocessor *this)

{
  long lVar1;
  undefined8 uVar2;
  Preprocessor *pPVar3;
  int iVar4;
  time_t tVar5;
  long *plVar6;
  ostream *poVar7;
  byte bVar8;
  int iVar9;
  char *pcVar10;
  ulong uVar11;
  long local_c50;
  ifstream P;
  byte abStack_c30 [488];
  long local_a48;
  ifstream D;
  byte abStack_a28 [488];
  long local_840;
  ofstream D_A;
  byte abStack_820 [216];
  ios_base aiStack_748 [264];
  long local_640;
  ofstream D_B;
  byte abStack_620 [216];
  ios_base aiStack_548 [264];
  long local_440;
  ofstream P_A;
  byte abStack_420 [216];
  ios_base aiStack_348 [264];
  long local_240;
  ofstream P_B;
  byte abStack_220 [216];
  ios_base aiStack_148 [264];
  Preprocessor *local_40;
  int local_34 [2];
  int read;
  
  std::ifstream::ifstream(&local_c50);
  std::ifstream::ifstream(&local_a48);
  std::ofstream::ofstream(&local_440);
  std::ofstream::ofstream(&local_240);
  std::ofstream::ofstream(&local_840);
  std::ofstream::ofstream(&local_640);
  std::ifstream::open((char *)&local_c50,(_Ios_Openmode)(this->p_path)._M_dataplus._M_p);
  std::ofstream::open((char *)&local_440,(_Ios_Openmode)(this->p_A_path)._M_dataplus._M_p);
  std::ofstream::open((char *)&local_240,(_Ios_Openmode)(this->p_B_path)._M_dataplus._M_p);
  if ((abStack_c30[*(long *)(local_c50 + -0x18)] & 5) == 0) {
    if ((abStack_420[*(long *)(local_440 + -0x18)] & 5) == 0) {
      local_40 = this;
      if ((abStack_220[*(long *)(local_240 + -0x18)] & 5) == 0) {
        local_34[0] = 0;
        tVar5 = time((time_t *)0x0);
        srand((uint)tVar5);
        iVar9 = -1;
        uVar11 = 1;
        while( true ) {
          plVar6 = (long *)std::istream::operator>>((istream *)&local_c50,local_34);
          if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0) break;
          iVar4 = rand();
          local_34[0] = local_34[0] - iVar4 % 1000;
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_440,local_34[0]);
          pcVar10 = " ";
          if ((int)(uVar11 / 5) * 5 + iVar9 == 0) {
            pcVar10 = "\n";
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar10,1);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_240,iVar4 % 1000);
          iVar9 = iVar9 + -1;
          uVar11 = (ulong)((int)uVar11 + 1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar10,1);
        }
        std::ifstream::close();
        pPVar3 = local_40;
        std::ofstream::close();
        std::ofstream::close();
        std::ifstream::open((char *)&local_a48,(_Ios_Openmode)(pPVar3->d_path)._M_dataplus._M_p);
        std::ofstream::open((char *)&local_840,(_Ios_Openmode)(pPVar3->d_A_path)._M_dataplus._M_p);
        std::ofstream::open((char *)&local_640,(_Ios_Openmode)(pPVar3->d_B_path)._M_dataplus._M_p);
        if ((abStack_a28[*(long *)(local_a48 + -0x18)] & 5) == 0) {
          if ((abStack_820[*(long *)(local_840 + -0x18)] & 5) == 0) {
            if ((abStack_620[*(long *)(local_640 + -0x18)] & 5) == 0) {
              bVar8 = 0;
              while( true ) {
                plVar6 = (long *)std::istream::operator>>((istream *)&local_a48,local_34);
                if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0) break;
                iVar9 = rand();
                local_34[0] = local_34[0] - iVar9 % 1000;
                poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_840,local_34[0]);
                pcVar10 = "\n";
                if (!(bool)(bVar8 & 1)) {
                  pcVar10 = " ";
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar10,1);
                poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_640,iVar9 % 1000);
                bVar8 = bVar8 + 1;
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar10,1);
              }
              std::ifstream::close();
              std::ofstream::close();
              std::ofstream::close();
              uVar2 = ___cxa_atexit;
              lVar1 = _VTT;
              local_640 = _VTT;
              *(undefined8 *)((long)&local_640 + *(long *)(_VTT + -0x18)) = ___cxa_atexit;
              std::filebuf::~filebuf((filebuf *)&D_B);
              std::ios_base::~ios_base(aiStack_548);
              local_840 = lVar1;
              *(undefined8 *)((long)&local_840 + *(long *)(lVar1 + -0x18)) = uVar2;
              std::filebuf::~filebuf((filebuf *)&D_A);
              std::ios_base::~ios_base(aiStack_748);
              local_240 = lVar1;
              *(undefined8 *)((long)&local_240 + *(long *)(lVar1 + -0x18)) = uVar2;
              std::filebuf::~filebuf((filebuf *)&P_B);
              std::ios_base::~ios_base(aiStack_148);
              local_440 = lVar1;
              *(undefined8 *)((long)&local_440 + *(long *)(lVar1 + -0x18)) = uVar2;
              std::filebuf::~filebuf((filebuf *)&P_A);
              std::ios_base::~ios_base(aiStack_348);
              std::ifstream::~ifstream(&local_a48);
              std::ifstream::~ifstream(&local_c50);
              return;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Preprocessor: Unable to create output data file at: ",
                       0x34);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(pPVar3->d_B_path)._M_dataplus._M_p,
                                (pPVar3->d_B_path)._M_string_length);
            std::endl<char,std::char_traits<char>>(poVar7);
            std::ios::clear((int)&local_640 + (int)*(undefined8 *)(local_640 + -0x18));
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Preprocessor: Unable to create output data file at: ",
                       0x34);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(pPVar3->d_A_path)._M_dataplus._M_p,
                                (pPVar3->d_A_path)._M_string_length);
            std::endl<char,std::char_traits<char>>(poVar7);
            std::ios::clear((int)&local_840 + (int)*(undefined8 *)(local_840 + -0x18));
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Preprocessor: Unable to locate input data file at: ",
                     0x33);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(pPVar3->d_path)._M_dataplus._M_p,
                              (pPVar3->d_path)._M_string_length);
          std::endl<char,std::char_traits<char>>(poVar7);
          std::ios::clear((int)&local_a48 + (int)*(undefined8 *)(local_a48 + -0x18));
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Preprocessor: Unable to create output program file at: ",
                   0x37);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(local_40->p_B_path)._M_dataplus._M_p,
                            (local_40->p_B_path)._M_string_length);
        std::endl<char,std::char_traits<char>>(poVar7);
        std::ios::clear((int)&local_240 + (int)*(undefined8 *)(local_240 + -0x18));
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Preprocessor: Unable to create output program file at: ",
                 0x37);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(this->p_A_path)._M_dataplus._M_p,
                          (this->p_A_path)._M_string_length);
      std::endl<char,std::char_traits<char>>(poVar7);
      std::ios::clear((int)&local_440 + (int)*(undefined8 *)(local_440 + -0x18));
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Preprocessor: Unable to locate input program file at: ",0x36);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(this->p_path)._M_dataplus._M_p,
                        (this->p_path)._M_string_length);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::ios::clear((int)&local_c50 + (int)*(undefined8 *)(local_c50 + -0x18));
  }
  exit(1);
}

Assistant:

void Preprocessor::Init()
{
  std::ifstream P, D;
  std::ofstream P_A, P_B, D_A, D_B;
  P.open(p_path.c_str());
  P_A.open(p_A_path.c_str());
  P_B.open(p_B_path.c_str());

  if (P.fail())
  {
    std::cout << "Preprocessor: Unable to locate input program file at: "<<p_path<<std::endl;
    P.clear();
    exit(1);
  }
  if (P_A.fail())
  {
    std::cout << "Preprocessor: Unable to create output program file at: "<<p_A_path<<std::endl;
    P_A.clear();
    exit(1);
  }
  if (P_B.fail())
  {
    std::cout << "Preprocessor: Unable to create output program file at: "<<p_B_path<<std::endl;
    P_B.clear();
    exit(1);
  }

  int read = 0, write = 0;
  int r = 0;
  int count = 0;
  bool eol = 0;
  srand(time(NULL));

  while (P >> read)
  {
    eol = ++count % 5;
    r = rand() % S_PARAM;
    read = read - r;
    P_A << read << ((eol == 0) ? "\n" : " ");
    P_B << r << ((eol == 0) ? "\n" : " ");
  }
  P.close();
  P_A.close();
  P_B.close();

  count = 0;
  eol = 0;
  D.open(d_path.c_str());
  D_A.open(d_A_path.c_str());
  D_B.open(d_B_path.c_str());
  
  if (D.fail())
  {
    std::cout << "Preprocessor: Unable to locate input data file at: "<<d_path<<std::endl;
    D.clear();
    exit(1);
  }
  if (D_A.fail())
  {
    std::cout << "Preprocessor: Unable to create output data file at: "<<d_A_path<<std::endl;
    D_A.clear();
    exit(1);
  }
  if (D_B.fail())
  {
    std::cout << "Preprocessor: Unable to create output data file at: "<<d_B_path<<std::endl;
    D_B.clear();
    exit(1);
  }
  
  while (D >> read)
  {
    eol = ++count % 2;
    r = rand() % S_PARAM;
    read = read - r;
    D_A << read << ((eol == 0) ? "\n" : " ");
    D_B << r << ((eol == 0) ? "\n" : " ");
  }
  D.close();
  D_A.close();
  D_B.close();
}